

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_TranslucentLine(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  byte *pbVar1;
  line_t *plVar2;
  int iVar3;
  uint uVar4;
  FLineIdIterator itr;
  
  itr.start = tagManager.IDHashFirst[arg0 & 0xff];
  iVar3 = 0xff;
  if ((uint)arg1 < 0xff) {
    iVar3 = arg1;
  }
  if (arg1 < 1) {
    iVar3 = 0;
  }
  itr.searchtag = arg0;
  while( true ) {
    uVar4 = FLineIdIterator::Next(&itr);
    plVar2 = lines;
    if ((int)uVar4 < 0) break;
    lines[uVar4].alpha = (double)iVar3 / 255.0;
    if (arg2 == 1) {
      pbVar1 = (byte *)((long)&plVar2[uVar4].flags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    else if (arg2 == 0) {
      pbVar1 = (byte *)((long)&plVar2[uVar4].flags + 1);
      *pbVar1 = *pbVar1 & 0xfb;
    }
    else {
      Printf("Unknown translucency type used with TranslucentLine\n");
    }
  }
  return 1;
}

Assistant:

FUNC(LS_TranslucentLine)
// TranslucentLine (id, amount, type)
{
	FLineIdIterator itr(arg0);
	int linenum;
	while ((linenum = itr.Next()) >= 0)
	{
		lines[linenum].alpha = clamp(arg1, 0, 255) / 255.;
		if (arg2 == 0)
		{
			lines[linenum].flags &= ~ML_ADDTRANS;
		}
		else if (arg2 == 1)
		{
			lines[linenum].flags |= ML_ADDTRANS;
		}
		else
		{
			Printf ("Unknown translucency type used with TranslucentLine\n");
		}
	}

	return true;
}